

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O2

void Curl_node_uremove(Curl_llist_node *e,void *user)

{
  Curl_llist *pCVar1;
  Curl_llist_node *pCVar2;
  Curl_llist_node *pCVar3;
  void *pvVar4;
  
  if (e != (Curl_llist_node *)0x0) {
    pCVar1 = e->_list;
    if (pCVar1->_head == e) {
      pCVar2 = e->_next;
      pCVar1->_head = pCVar2;
      if (pCVar2 == (Curl_llist_node *)0x0) {
        pCVar1->_tail = (Curl_llist_node *)0x0;
      }
      else {
        pCVar2->_prev = (Curl_llist_node *)0x0;
      }
    }
    else {
      pCVar2 = e->_prev;
      pCVar3 = e->_next;
      if (pCVar2 != (Curl_llist_node *)0x0) {
        pCVar2->_next = pCVar3;
      }
      if (pCVar3 == (Curl_llist_node *)0x0) {
        pCVar1->_tail = pCVar2;
      }
      else {
        pCVar3->_prev = pCVar2;
      }
    }
    pvVar4 = e->_ptr;
    e->_prev = (Curl_llist_node *)0x0;
    e->_next = (Curl_llist_node *)0x0;
    e->_list = (Curl_llist *)0x0;
    e->_ptr = (void *)0x0;
    pCVar1->_size = pCVar1->_size - 1;
    if (pCVar1->_dtor != (Curl_llist_dtor)0x0) {
      (*pCVar1->_dtor)(user,pvVar4);
      return;
    }
  }
  return;
}

Assistant:

void
Curl_node_uremove(struct Curl_llist_node *e, void *user)
{
  void *ptr;
  struct Curl_llist *list;
  if(!e)
    return;

  list = e->_list;
  DEBUGASSERT(list);
  DEBUGASSERT(list->_init == LLISTINIT);
  DEBUGASSERT(list->_size);
  DEBUGASSERT(e->_init == NODEINIT);
  if(e == list->_head) {
    list->_head = e->_next;

    if(!list->_head)
      list->_tail = NULL;
    else
      e->_next->_prev = NULL;
  }
  else {
    if(e->_prev)
      e->_prev->_next = e->_next;

    if(!e->_next)
      list->_tail = e->_prev;
    else
      e->_next->_prev = e->_prev;
  }

  ptr = e->_ptr;

  e->_list = NULL;
  e->_ptr  = NULL;
  e->_prev = NULL;
  e->_next = NULL;
#ifdef DEBUGBUILD
  e->_init = NODEREM; /* specific pattern on remove - not zero */
#endif

  --list->_size;

  /* call the dtor() last for when it actually frees the 'e' memory itself */
  if(list->_dtor)
    list->_dtor(user, ptr);
}